

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

void __thiscall CorUnix::CPalThread::ReleaseThreadReference(CPalThread *this)

{
  uint uVar1;
  LONG lRefCount;
  CPalThread *this_local;
  
  uVar1 = InterlockedDecrement(&this->m_lRefCount);
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"] %s %s:%d","ReleaseThreadReference",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
            ,0x81d);
    fprintf(_stderr,
            "Expression: lRefCount >= 0, Description: Released a thread and ended with a negative refcount (%ld)\n"
            ,(ulong)uVar1);
  }
  if (uVar1 == 0) {
    FreeTHREAD(this);
  }
  return;
}

Assistant:

void
CPalThread::ReleaseThreadReference(
    void
    )
{
    LONG lRefCount = InterlockedDecrement(&m_lRefCount);
    _ASSERT_MSG(lRefCount >= 0, "Released a thread and ended with a negative refcount (%ld)\n", lRefCount);
    if (0 == lRefCount)
    {
        FreeTHREAD(this);
    }

}